

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O0

int32_t DotProductWithScale(int16_t *vector1,int16_t *vector2,size_t length,int scaling)

{
  byte bVar1;
  ulong local_38;
  size_t i;
  int64_t sum;
  int scaling_local;
  size_t length_local;
  int16_t *vector2_local;
  int16_t *vector1_local;
  
  i = 0;
  for (local_38 = 0; bVar1 = (byte)scaling, local_38 + 3 < length; local_38 = local_38 + 4) {
    i = (long)((int)vector1[local_38 + 3] * (int)vector2[local_38 + 3] >> (bVar1 & 0x1f)) +
        (long)((int)vector1[local_38 + 2] * (int)vector2[local_38 + 2] >> (bVar1 & 0x1f)) +
        (long)((int)vector1[local_38 + 1] * (int)vector2[local_38 + 1] >> (bVar1 & 0x1f)) +
        (long)((int)vector1[local_38] * (int)vector2[local_38] >> (bVar1 & 0x1f)) + i;
  }
  for (; local_38 < length; local_38 = local_38 + 1) {
    i = (long)((int)vector1[local_38] * (int)vector2[local_38] >> (bVar1 & 0x1f)) + i;
  }
  return (int32_t)i;
}

Assistant:

int32_t DotProductWithScale(const int16_t *vector1, const int16_t *vector2, size_t length, int scaling) {
    int64_t sum = 0;
    size_t i = 0;

    /* Unroll the loop to improve performance. */
    for (i = 0; i + 3 < length; i += 4) {
        sum += (vector1[i + 0] * vector2[i + 0]) >> scaling;
        sum += (vector1[i + 1] * vector2[i + 1]) >> scaling;
        sum += (vector1[i + 2] * vector2[i + 2]) >> scaling;
        sum += (vector1[i + 3] * vector2[i + 3]) >> scaling;
    }
    for (; i < length; i++) {
        sum += (vector1[i] * vector2[i]) >> scaling;
    }

    return (int32_t) (sum);
}